

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O2

StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
* draco::CreatePointCloudDecoder
            (StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
             *__return_storage_ptr__,int8_t method)

{
  PointCloudDecoder *this;
  int iVar1;
  undefined7 in_register_00000031;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [40];
  
  iVar1 = (int)CONCAT71(in_register_00000031,method);
  if (iVar1 == 1) {
    this = (PointCloudDecoder *)operator_new(0x58);
    ((PointCloudDecoder *)&this->_vptr_PointCloudDecoder)->_vptr_PointCloudDecoder =
         (_func_int **)0x0;
    this->point_cloud_ = (PointCloud *)0x0;
    (this->attributes_decoders_).
    super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
    (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data + 0x10) = (pointer)0x0;
    this->buffer_ = (DecoderBuffer *)0x0;
    this->version_major_ = '\0';
    this->version_minor_ = '\0';
    *(undefined6 *)&this->field_0x4a = 0;
    this->options_ = (DecoderOptions *)0x0;
    PointCloudKdTreeDecoder::PointCloudKdTreeDecoder((PointCloudKdTreeDecoder *)this);
  }
  else {
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_58,"Unsupported encoding method.",&local_59);
      local_38._0_4_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)(local_38 + 8),local_58);
      StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
      ::StatusOr(__return_storage_ptr__,(Status *)local_38);
      std::__cxx11::string::~string((string *)(local_38 + 8));
      std::__cxx11::string::~string(local_58);
      return __return_storage_ptr__;
    }
    this = (PointCloudDecoder *)operator_new(0x58);
    ((PointCloudDecoder *)&this->_vptr_PointCloudDecoder)->_vptr_PointCloudDecoder =
         (_func_int **)0x0;
    this->point_cloud_ = (PointCloud *)0x0;
    (this->attributes_decoders_).
    super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl + 0x10) = (pointer)0x0;
    (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
     + 0x10) = (pointer)0x0;
    this->buffer_ = (DecoderBuffer *)0x0;
    this->version_major_ = '\0';
    this->version_minor_ = '\0';
    *(undefined6 *)&this->field_0x4a = 0;
    this->options_ = (DecoderOptions *)0x0;
    PointCloudSequentialDecoder::PointCloudSequentialDecoder((PointCloudSequentialDecoder *)this);
  }
  (__return_storage_ptr__->status_).code_ = OK;
  (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
  (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
  (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->value_)._M_t.
  super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>.
  _M_t.
  super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
  .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl = this;
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<PointCloudDecoder>> CreatePointCloudDecoder(
    int8_t method) {
  if (method == POINT_CLOUD_SEQUENTIAL_ENCODING) {
    return std::unique_ptr<PointCloudDecoder>(
        new PointCloudSequentialDecoder());
  } else if (method == POINT_CLOUD_KD_TREE_ENCODING) {
    return std::unique_ptr<PointCloudDecoder>(new PointCloudKdTreeDecoder());
  }
  return Status(Status::DRACO_ERROR, "Unsupported encoding method.");
}